

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.cpp
# Opt level: O3

void Js::InlineCache::VerifyRegistrationForInvalidation
               (InlineCache *cache,ScriptContext *scriptContext,PropertyId propertyId)

{
  Type *pTVar1;
  InlineCache **ppIVar2;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  undefined4 *puVar8;
  byte bVar9;
  bool bVar10;
  bool bVar11;
  
  bVar10 = (undefined1  [24])((undefined1  [24])cache->u & (undefined1  [24])0x1) !=
           (undefined1  [24])0x0;
  pTVar1 = (cache->u).local.typeWithoutProperty;
  bVar11 = (~(uint)pTVar1 & 0xd) == 0;
  bVar7 = pTVar1 != (Type *)0x0 && bVar10 || bVar11;
  bVar9 = (~(cache->u).accessor.field_1.rawUInt16 & 0xb) == 0 | *(byte *)&cache->u;
  ppIVar2 = cache->invalidationListSlotPtr;
  if (ppIVar2 == (InlineCache **)0x0) {
    bVar4 = false;
    bVar5 = false;
  }
  else {
    bVar4 = ThreadContext::IsProtoInlineCacheRegistered
                      (scriptContext->threadContext,cache,propertyId);
    bVar5 = ThreadContext::IsStoreFieldInlineCacheRegistered
                      (scriptContext->threadContext,cache,propertyId);
  }
  if ((bVar9 & bVar7) == 1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                ,0x238,"(howManyInvalidationsNeeded <= 1)",
                                "howManyInvalidationsNeeded <= 1");
    if (!bVar6) goto LAB_0097055b;
    *puVar8 = 0;
  }
  if ((~(bVar9 | bVar7) & 1) == 0 && ppIVar2 == (InlineCache **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                ,0x239,"((howManyInvalidationsNeeded == 0) || hasListSlotPtr)",
                                "(howManyInvalidationsNeeded == 0) || hasListSlotPtr");
    if (!bVar7) goto LAB_0097055b;
    *puVar8 = 0;
  }
  if ((~bVar9 & 1) == 0 && bVar4 == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                ,0x23a,"(!needsProtoInvalidation || isProtoRegistered)",
                                "!needsProtoInvalidation || isProtoRegistered");
    if (!bVar7) goto LAB_0097055b;
    *puVar8 = 0;
  }
  if ((pTVar1 != (Type *)0x0 && bVar10 || bVar11) && bVar5 == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                ,0x23b,"(!needsStoreFieldInvalidation || isStoreFieldRegistered)",
                                "!needsStoreFieldInvalidation || isStoreFieldRegistered");
    if (!bVar7) goto LAB_0097055b;
    *puVar8 = 0;
  }
  if ((ppIVar2 == (InlineCache **)0x0) || (bVar4 != false || bVar5 != false)) {
    if (ppIVar2 == (InlineCache **)0x0) {
      return;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                ,0x23c,"(!hasListSlotPtr || howManyRegistrations > 0)",
                                "!hasListSlotPtr || howManyRegistrations > 0");
    if (!bVar7) goto LAB_0097055b;
    *puVar8 = 0;
  }
  if (*cache->invalidationListSlotPtr != cache) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                ,0x23d,
                                "(!hasListSlotPtr || (*cache->invalidationListSlotPtr) == cache)",
                                "!hasListSlotPtr || (*cache->invalidationListSlotPtr) == cache");
    if (!bVar7) {
LAB_0097055b:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar8 = 0;
  }
  return;
}

Assistant:

void InlineCache::VerifyRegistrationForInvalidation(const InlineCache* cache, ScriptContext* scriptContext, Js::PropertyId propertyId)
    {
        bool needsProtoInvalidation = cache->NeedsToBeRegisteredForProtoInvalidation();
        bool needsStoreFieldInvalidation = cache->NeedsToBeRegisteredForStoreFieldInvalidation();
        int howManyInvalidationsNeeded = (int)needsProtoInvalidation + (int)needsStoreFieldInvalidation;
        bool hasListSlotPtr = cache->invalidationListSlotPtr != nullptr;
        bool isProtoRegistered = hasListSlotPtr ? scriptContext->GetThreadContext()->IsProtoInlineCacheRegistered(cache, propertyId) : false;
        bool isStoreFieldRegistered = hasListSlotPtr ? scriptContext->GetThreadContext()->IsStoreFieldInlineCacheRegistered(cache, propertyId) : false;
        int howManyRegistrations = (int)isProtoRegistered + (int)isStoreFieldRegistered;

        Assert(howManyInvalidationsNeeded <= 1);
        Assert((howManyInvalidationsNeeded == 0) || hasListSlotPtr);
        Assert(!needsProtoInvalidation || isProtoRegistered);
        Assert(!needsStoreFieldInvalidation || isStoreFieldRegistered);
        Assert(!hasListSlotPtr || howManyRegistrations > 0);
        Assert(!hasListSlotPtr || (*cache->invalidationListSlotPtr) == cache);
    }